

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBInterpolater.cpp
# Opt level: O2

void __thiscall
amrex::EBCellConservativeLinear::interp
          (EBCellConservativeLinear *this,FArrayBox *crse,int crse_comp,FArrayBox *fine,
          int fine_comp,int ncomp,Box *fine_region,IntVect *ratio,Geometry *crse_geom,
          Geometry *fine_geom,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int actual_comp,int actual_state,RunOn runon)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  EBCellFlagFab *this_00;
  EBCellFlagFab *this_01;
  EBCellFlag *pEVar13;
  double *pdVar14;
  undefined8 uVar15;
  FabType FVar16;
  FabType FVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  double *pdVar31;
  long lVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  EBFArrayBox *crse_eb;
  Box lhs;
  double *local_198;
  double *local_190;
  double *local_188;
  Box local_128 [7];
  Box local_4c;
  
  amrex::CellConservativeLinear::interp
            (&this->super_CellConservativeLinear,crse,crse_comp,fine,fine_comp,ncomp,fine_region,
             ratio,crse_geom,fine_geom,bcr,actual_comp,actual_state,runon);
  local_128[0].smallend.vect._0_8_ = *(undefined8 *)(fine_region->smallend).vect;
  uVar15 = *(undefined8 *)((fine_region->smallend).vect + 2);
  local_128[0]._20_8_ = *(undefined8 *)((fine_region->bigend).vect + 2);
  local_128[0].bigend.vect[1] = (int)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  local_128[0].smallend.vect[2] = (int)uVar15;
  local_128[0].bigend.vect[0] = (int)((ulong)uVar15 >> 0x20);
  Box::operator&=(local_128,&(fine->super_BaseFab<double>).domain);
  if (*(int *)&(crse->super_BaseFab<double>).field_0x44 != 0) {
    this_00 = (EBCellFlagFab *)crse[1].super_BaseFab<double>._vptr_BaseFab;
    this_01 = (EBCellFlagFab *)fine[1].super_BaseFab<double>._vptr_BaseFab;
    (*(this->super_CellConservativeLinear).super_Interpolater.super_InterpBase._vptr_InterpBase[3])
              (&local_4c,this,local_128,ratio);
    FVar16 = EBCellFlagFab::getType(this_01,local_128);
    FVar17 = EBCellFlagFab::getType(this_00,&local_4c);
    if ((FVar16 == multivalued) || (FVar17 == multivalued)) {
      Abort_host("EBCellConservativeLinear::interp: multivalued not implemented");
    }
    else if (FVar16 != covered) {
      iVar1 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
      iVar2 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
      iVar3 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1];
      lVar20 = (long)(((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] - iVar1) +
                     1);
      iVar4 = (fine->super_BaseFab<double>).domain.smallend.vect[0];
      iVar5 = (fine->super_BaseFab<double>).domain.smallend.vect[1];
      iVar6 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
      lVar30 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[2] - iVar6) + 1);
      iVar7 = (crse->super_BaseFab<double>).domain.smallend.vect[0];
      lVar29 = (long)(((crse->super_BaseFab<double>).domain.bigend.vect[0] - iVar7) + 1);
      iVar8 = (crse->super_BaseFab<double>).domain.smallend.vect[1];
      lVar32 = (((crse->super_BaseFab<double>).domain.bigend.vect[1] - iVar8) + 1) * lVar29;
      iVar9 = (crse->super_BaseFab<double>).domain.smallend.vect[2];
      iVar10 = (crse->super_BaseFab<double>).domain.bigend.vect[2];
      uVar33 = 0;
      uVar35 = (ulong)(uint)ncomp;
      if (ncomp < 1) {
        uVar35 = uVar33;
      }
      lVar27 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[1] - iVar5) + 1);
      lVar22 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[0] - iVar4) + 1);
      local_198 = (double *)
                  ((((long)local_128[0].smallend.vect[2] * 8 + fine_comp * lVar30 * 8 +
                    (long)iVar6 * -8) * lVar27 + (long)local_128[0].smallend.vect[1] * 8 +
                   (long)iVar5 * -8) * lVar22 + (long)local_128[0].smallend.vect[0] * 8 +
                   (long)iVar4 * -8 + (long)(fine->super_BaseFab<double>).dptr);
      pEVar13 = (this_00->super_BaseFab<amrex::EBCellFlag>).dptr;
      iVar4 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      pdVar14 = (crse->super_BaseFab<double>).dptr;
      iVar5 = ratio->vect[0];
      iVar6 = ratio->vect[1];
      iVar11 = ratio->vect[2];
      lVar27 = lVar27 * lVar22;
      for (; uVar33 != uVar35; uVar33 = uVar33 + 1) {
        local_190 = local_198;
        for (uVar23 = (long)local_128[0].smallend.vect[2];
            (long)uVar23 <= (long)local_128[0].bigend.vect[2]; uVar23 = uVar23 + 1) {
          uVar21 = (uint)uVar23;
          local_188 = local_190;
          for (uVar28 = (long)local_128[0].smallend.vect[1];
              (long)uVar28 <= (long)local_128[0].bigend.vect[1]; uVar28 = uVar28 + 1) {
            uVar26 = (uint)uVar28;
            pdVar31 = local_188;
            uVar19 = ~local_128[0].smallend.vect[0];
            for (uVar24 = (long)local_128[0].smallend.vect[0];
                (long)uVar24 <= (long)local_128[0].bigend.vect[0]; uVar24 = uVar24 + 1) {
              uVar25 = (uint)uVar24;
              if (iVar5 == 4) {
                if ((long)uVar24 < 0) {
                  uVar25 = (int)uVar25 >> 2;
                }
                else {
                  uVar25 = uVar25 >> 2;
                }
              }
              else if (iVar5 == 2) {
                if ((long)uVar24 < 0) {
                  uVar25 = (int)uVar25 >> 1;
                }
                else {
                  uVar25 = uVar25 >> 1;
                }
              }
              else if (iVar5 != 1) {
                if ((long)uVar24 < 0) {
                  uVar25 = ~((int)uVar19 / iVar5);
                }
                else {
                  uVar25 = (uint)((long)((ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 |
                                        uVar24 & 0xffffffff) / (long)iVar5);
                }
              }
              uVar34 = uVar26;
              if (((iVar6 != 1) && (uVar34 = (int)uVar26 >> 2, iVar6 != 4)) &&
                 (uVar34 = (int)uVar26 >> 1, iVar6 != 2)) {
                if ((long)uVar28 < 0) {
                  uVar34 = ~((int)~uVar26 / iVar6);
                }
                else {
                  uVar34 = (uint)((long)((ulong)(uint)((int)uVar26 >> 0x1f) << 0x20 |
                                        uVar28 & 0xffffffff) / (long)iVar6);
                }
              }
              uVar18 = uVar21;
              if (((iVar11 != 1) && (uVar18 = (int)uVar21 >> 2, iVar11 != 4)) &&
                 (uVar18 = (int)uVar21 >> 1, iVar11 != 2)) {
                if ((long)uVar23 < 0) {
                  uVar18 = ~((int)~uVar21 / iVar11);
                }
                else {
                  uVar18 = (uint)((long)((ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 |
                                        uVar23 & 0xffffffff) / (long)iVar11);
                }
              }
              uVar12 = pEVar13[(int)(uVar34 - iVar2) * lVar20 +
                               (long)(int)(uVar25 - iVar1) +
                               ((long)(int)uVar18 - (long)iVar4) * ((iVar3 - iVar2) + 1) * lVar20].
                       flag;
              if (((uVar12 >> 0xf & 1) - ((int)uVar12 >> 0x1f)) + (uint)((uVar12 >> 0x10 & 1) != 0)
                  + (uVar12 >> 0x11 & 1) + (uint)((uVar12 >> 0x13 & 1) != 0) + (uVar12 >> 0x14 & 1)
                  + (uint)((uVar12 >> 0x15 & 1) != 0) + (uVar12 >> 0x16 & 1) +
                  (uint)((uVar12 >> 5 & 1) != 0) + (uVar12 >> 6 & 1) +
                  (uint)((uVar12 >> 7 & 1) != 0) + (uVar12 >> 8 & 1) +
                  (uint)((uVar12 >> 9 & 1) != 0) + (uVar12 >> 10 & 1) +
                  (uint)((uVar12 >> 0xb & 1) != 0) + (uVar12 >> 0xc & 1) +
                  (uint)((uVar12 >> 0xd & 1) != 0) + (uVar12 >> 0x17 & 1) +
                  (uint)((uVar12 >> 0x18 & 1) != 0) + (uVar12 >> 0x19 & 1) +
                  (uint)((uVar12 >> 0x1a & 1) != 0) + (uVar12 >> 0x1b & 1) +
                  (uint)((uVar12 >> 0x1c & 1) != 0) + (uVar12 >> 0x1d & 1) +
                  (uint)((uVar12 >> 0x1e & 1) != 0) + (uint)((uVar12 >> 0xe & 1) != 0) + 1 < 0x1b) {
                *pdVar31 = pdVar14[(int)(uVar34 - iVar8) * lVar29 +
                                   (long)(int)(uVar25 - iVar7) +
                                   (int)(uVar18 - iVar9) * lVar32 +
                                   ((long)crse_comp + uVar33) * ((iVar10 - iVar9) + 1) * lVar32];
              }
              pdVar31 = pdVar31 + 1;
              uVar19 = uVar19 - 1;
            }
            local_188 = local_188 + lVar22;
          }
          local_190 = local_190 + lVar27;
        }
        local_198 = local_198 + lVar30 * lVar27;
      }
    }
  }
  return;
}

Assistant:

void
EBCellConservativeLinear::interp (const FArrayBox& crse,
                                  int              crse_comp,
                                  FArrayBox&       fine,
                                  int              fine_comp,
                                  int              ncomp,
                                  const Box&       fine_region,
                                  const IntVect&   ratio,
                                  const Geometry&  crse_geom,
                                  const Geometry&  fine_geom,
                                  Vector<BCRec> const&  bcr,
                                  int              actual_comp,
                                  int              actual_state,
                                  RunOn            runon)
{
    CellConservativeLinear::interp(crse, crse_comp, fine, fine_comp, ncomp, fine_region, ratio,
                                   crse_geom, fine_geom, bcr, actual_comp, actual_state, runon);

    const Box& target_fine_region = fine_region & fine.box();

    if (crse.getType() == FabType::regular)
    {
        BL_ASSERT(amrex::getEBCellFlagFab(fine).getType(target_fine_region) == FabType::regular);
    }
    else
    {
        const EBFArrayBox& crse_eb = static_cast<EBFArrayBox const&>(crse);
        EBFArrayBox&       fine_eb = static_cast<EBFArrayBox      &>(fine);

        const EBCellFlagFab& crse_flag = crse_eb.getEBCellFlagFab();
        const EBCellFlagFab& fine_flag = fine_eb.getEBCellFlagFab();

        const Box& crse_bx = CoarseBox(target_fine_region,ratio);

        const FabType ftype = fine_flag.getType(target_fine_region);
        const FabType ctype = crse_flag.getType(crse_bx);

        if (ftype == FabType::multivalued || ctype == FabType::multivalued)
        {
            amrex::Abort("EBCellConservativeLinear::interp: multivalued not implemented");
        }
        else if (ftype == FabType::covered)
        {
            ; // don't need to do anything special
        }
        else
        {
            const auto& cflag = crse_flag.const_array();
            auto const& fa = fine.array();
            auto const& ca = crse.const_array();
            AMREX_HOST_DEVICE_FOR_4D_FLAG(runon, target_fine_region, ncomp, i, j, k, n,
            {
                Dim3 cxyz = amrex::coarsen(Dim3{i,j,k}, ratio);
                if (cflag(cxyz.x,cxyz.y,cxyz.z).numNeighbors() < AMREX_D_TERM(3,*3,*3)) {
                    fa(i,j,k,n+fine_comp) = ca(cxyz.x,cxyz.y,cxyz.z,n+crse_comp);
                }
            });
        }
    }
}